

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

bool crt_pid_file(pid_t pid,string *path)

{
  bool bVar1;
  bool local_39;
  string local_38;
  string *local_18;
  string *path_local;
  pid_t pid_local;
  
  local_18 = path;
  path_local._4_4_ = pid;
  to_str_abi_cxx11_(&local_38,pid);
  local_39 = false;
  bVar1 = write_file(path,&local_38,&local_39);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool crt_pid_file(const pid_t pid, const std::string &path) {
    return write_file(path, to_str(pid));
}